

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_reader.hpp
# Opt level: O2

ssize_t __thiscall
jsoncons::bson::
basic_bson_reader<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::read(basic_bson_reader<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
       *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t sVar1;
  ser_error *this_00;
  error_code ec_00;
  undefined1 auVar2 [16];
  error_code ec;
  
  ec._M_value = 0;
  auVar2 = std::_V2::system_category();
  ec._M_cat = auVar2._0_8_;
  sVar1 = read(this,(int)&ec,auVar2._8_8_,__nbytes);
  if (ec._M_value == 0) {
    return sVar1;
  }
  this_00 = (ser_error *)__cxa_allocate_exception(0x58);
  ec_00._4_4_ = 0;
  ec_00._M_value = ec._M_value;
  ec_00._M_cat = ec._M_cat;
  ser_error::ser_error(this_00,ec_00,0,(this->parser_).source_.position_);
  __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

void read()
    {
        std::error_code ec;
        read(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec,line(),column()));
        }
    }